

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildValue-C-API.cpp
# Opt level: O0

llb_build_value * llb_build_value_make_existing_input(llb_build_value_file_info_t fileInfo)

{
  FileInfo outputInfo;
  llb_build_value *this;
  llb_build_value_file_info_t *fileInfo_00;
  FileInfo local_c8;
  BuildValue local_78;
  
  fileInfo_00 = (llb_build_value_file_info_t *)&stack0x00000008;
  this = (llb_build_value *)operator_new(0x70);
  convertFileInfo(&local_c8,fileInfo_00);
  outputInfo.inode = local_c8.mode;
  outputInfo.device = local_c8.inode;
  outputInfo.mode = local_c8.size;
  outputInfo.size = local_c8.modTime.seconds;
  outputInfo.modTime.seconds = local_c8.modTime.nanoseconds;
  outputInfo.modTime.nanoseconds._0_1_ = local_c8.checksum.bytes[0];
  outputInfo.modTime.nanoseconds._1_1_ = local_c8.checksum.bytes[1];
  outputInfo.modTime.nanoseconds._2_1_ = local_c8.checksum.bytes[2];
  outputInfo.modTime.nanoseconds._3_1_ = local_c8.checksum.bytes[3];
  outputInfo.modTime.nanoseconds._4_1_ = local_c8.checksum.bytes[4];
  outputInfo.modTime.nanoseconds._5_1_ = local_c8.checksum.bytes[5];
  outputInfo.modTime.nanoseconds._6_1_ = local_c8.checksum.bytes[6];
  outputInfo.modTime.nanoseconds._7_1_ = local_c8.checksum.bytes[7];
  outputInfo.checksum.bytes[0] = local_c8.checksum.bytes[8];
  outputInfo.checksum.bytes[1] = local_c8.checksum.bytes[9];
  outputInfo.checksum.bytes[2] = local_c8.checksum.bytes[10];
  outputInfo.checksum.bytes[3] = local_c8.checksum.bytes[0xb];
  outputInfo.checksum.bytes[4] = local_c8.checksum.bytes[0xc];
  outputInfo.checksum.bytes[5] = local_c8.checksum.bytes[0xd];
  outputInfo.checksum.bytes[6] = local_c8.checksum.bytes[0xe];
  outputInfo.checksum.bytes[7] = local_c8.checksum.bytes[0xf];
  outputInfo.checksum.bytes[8] = local_c8.checksum.bytes[0x10];
  outputInfo.checksum.bytes[9] = local_c8.checksum.bytes[0x11];
  outputInfo.checksum.bytes[10] = local_c8.checksum.bytes[0x12];
  outputInfo.checksum.bytes[0xb] = local_c8.checksum.bytes[0x13];
  outputInfo.checksum.bytes[0xc] = local_c8.checksum.bytes[0x14];
  outputInfo.checksum.bytes[0xd] = local_c8.checksum.bytes[0x15];
  outputInfo.checksum.bytes[0xe] = local_c8.checksum.bytes[0x16];
  outputInfo.checksum.bytes[0xf] = local_c8.checksum.bytes[0x17];
  outputInfo.checksum.bytes[0x10] = local_c8.checksum.bytes[0x18];
  outputInfo.checksum.bytes[0x11] = local_c8.checksum.bytes[0x19];
  outputInfo.checksum.bytes[0x12] = local_c8.checksum.bytes[0x1a];
  outputInfo.checksum.bytes[0x13] = local_c8.checksum.bytes[0x1b];
  outputInfo.checksum.bytes[0x14] = local_c8.checksum.bytes[0x1c];
  outputInfo.checksum.bytes[0x15] = local_c8.checksum.bytes[0x1d];
  outputInfo.checksum.bytes[0x16] = local_c8.checksum.bytes[0x1e];
  outputInfo.checksum.bytes[0x17] = local_c8.checksum.bytes[0x1f];
  outputInfo.checksum.bytes._24_8_ = fileInfo_00;
  llbuild::buildsystem::BuildValue::makeExistingInput(outputInfo);
  anon_unknown.dwarf_1efc24::CAPIBuildValue::CAPIBuildValue((CAPIBuildValue *)this,&local_78);
  llbuild::buildsystem::BuildValue::~BuildValue(&local_78);
  return this;
}

Assistant:

llb_build_value *llb_build_value_make_existing_input(llb_build_value_file_info_t fileInfo) {
  return (llb_build_value *)new CAPIBuildValue(BuildValue::makeExistingInput(convertFileInfo(fileInfo)));
}